

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::GridMeshNode::GridMeshNode
          (GridMeshNode *this,Ref<embree::SceneGraph::GridMeshNode> *imesh,Transformations *spaces)

{
  MaterialNode *pMVar1;
  
  Node::Node(&this->super_Node,true);
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__GridMeshNode_002a7b90;
  this->time_range = imesh->ptr->time_range;
  transformMSMBlurVec3faBuffer(&this->positions,&imesh->ptr->positions,spaces);
  std::
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  ::vector(&this->grids,&imesh->ptr->grids);
  pMVar1 = (imesh->ptr->material).ptr;
  (this->material).ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  return;
}

Assistant:

GridMeshNode (Ref<SceneGraph::GridMeshNode> imesh, const Transformations& spaces)
        : Node(true),
         time_range(imesh->time_range),
          positions(transformMSMBlurVec3faBuffer(imesh->positions,spaces)),
        grids(imesh->grids), material(imesh->material) {}